

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

uint32_t cfd::core::ConfidentialTxIn::EstimateTxInSize
                   (AddressType addr_type,Script *redeem_script,uint32_t pegin_btc_tx_size,
                   Script *claim_script,bool is_issuance,bool is_blind,uint32_t *witness_area_size,
                   uint32_t *no_witness_area_size,bool is_reissuance,Script *scriptsig_template,
                   int exponent,int minimum_bits,uint32_t *rangeproof_size,uint32_t txoutproof_size)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_t sVar4;
  uint32_t local_9c;
  undefined1 local_98 [4];
  uint32_t work_proof_size;
  Script local_70;
  uint32_t local_34;
  uint32_t local_30;
  uint32_t size;
  uint32_t witness_size;
  bool is_reissuance_local;
  bool is_blind_local;
  bool is_issuance_local;
  Script *claim_script_local;
  Script *pSStack_18;
  uint32_t pegin_btc_tx_size_local;
  Script *redeem_script_local;
  AddressType addr_type_local;
  
  size._1_1_ = is_reissuance;
  local_30 = 0;
  local_34 = 0;
  size._2_1_ = is_blind;
  size._3_1_ = is_issuance;
  _witness_size = claim_script;
  claim_script_local._4_4_ = pegin_btc_tx_size;
  pSStack_18 = redeem_script;
  redeem_script_local._4_4_ = addr_type;
  Script::Script(&local_70,redeem_script);
  TxIn::EstimateTxInSize(addr_type,&local_70,&local_30,&local_34,scriptsig_template);
  Script::~Script(&local_70);
  if (((size._3_1_ & 1) != 0) || ((size._1_1_ & 1) != 0)) {
    if ((size._2_1_ & 1) == 0) {
      local_34 = local_34 + 0x52;
    }
    else {
      local_34 = local_34 + 0x82;
    }
  }
  if ((((claim_script_local._4_4_ != 0) || ((size._3_1_ & 1) != 0)) || ((size._1_1_ & 1) != 0)) ||
     (local_30 != 0)) {
    if (local_30 == 0) {
      local_30 = 1;
    }
    if (claim_script_local._4_4_ != 0) {
      uVar2 = GetSerializedSize(claim_script_local._4_4_);
      uVar3 = GetSerializedSize(txoutproof_size);
      local_30 = uVar2 + uVar3 + 0x4c + local_30;
      bVar1 = Script::IsEmpty(claim_script);
      if (!bVar1) {
        Script::GetData((ByteData *)local_98,claim_script);
        sVar4 = ByteData::GetSerializeSize((ByteData *)local_98);
        local_30 = (int)sVar4 + local_30;
        ByteData::~ByteData((ByteData *)local_98);
      }
    }
    if ((((size._3_1_ & 1) == 0) && ((size._1_1_ & 1) == 0)) || ((size._2_1_ & 1) == 0)) {
      local_30 = local_30 + 3;
    }
    else {
      if ((rangeproof_size == (uint32_t *)0x0) || (*rangeproof_size == 0)) {
        local_30 = local_30 + 1;
        local_9c = CalculateRangeProofSize(2100000000000000,exponent,minimum_bits);
        local_9c = local_9c + 4;
        if (rangeproof_size != (uint32_t *)0x0) {
          *rangeproof_size = local_9c;
        }
      }
      else {
        local_9c = *rangeproof_size;
        local_30 = local_30 + 1;
      }
      if ((size._1_1_ & 1) == 0) {
        local_9c = local_9c << 1;
      }
      else {
        local_9c = local_9c + 1;
      }
      local_30 = local_9c + local_30;
    }
  }
  if (witness_area_size != (uint32_t *)0x0) {
    *witness_area_size = local_30;
  }
  if (no_witness_area_size != (uint32_t *)0x0) {
    *no_witness_area_size = local_34;
  }
  return local_34 + local_30;
}

Assistant:

uint32_t ConfidentialTxIn::EstimateTxInSize(
    AddressType addr_type, Script redeem_script, uint32_t pegin_btc_tx_size,
    Script claim_script, bool is_issuance, bool is_blind,
    uint32_t *witness_area_size, uint32_t *no_witness_area_size,
    bool is_reissuance, const Script *scriptsig_template, int exponent,
    int minimum_bits, uint32_t *rangeproof_size, uint32_t txoutproof_size) {
  // TODO(k-matsuzawa): Set amount upper limit and calculate maximum size
  static constexpr const int64_t kIssuanceAmount = kMaxAmount;
  uint32_t witness_size = 0;
  uint32_t size = 0;
  TxIn::EstimateTxInSize(
      addr_type, redeem_script, &witness_size, &size, scriptsig_template);

  if (is_issuance || is_reissuance) {
    if (is_blind) {
      size += kIssuanceBlindSize;
    } else {
      size += kIssuanceAppendSize;
    }
  }

  if ((pegin_btc_tx_size != 0) || is_issuance || is_reissuance ||
      (witness_size != 0)) {
    if (witness_size == 0) {
      witness_size += 1;  // witness size
    }

    if (pegin_btc_tx_size != 0) {
      witness_size += GetSerializedSize(pegin_btc_tx_size) +
                      GetSerializedSize(txoutproof_size) + kPeginWitnessSize;
      if (!claim_script.IsEmpty()) {
        witness_size +=
            static_cast<uint32_t>(claim_script.GetData().GetSerializeSize());
      }
    }
    witness_size += 1;  // pegin witness num

    if ((!is_issuance && !is_reissuance) || !is_blind) {
      witness_size += 2;  // issuance rangeproof size
    } else {
      uint32_t work_proof_size = 0;
      if ((rangeproof_size != nullptr) && (*rangeproof_size != 0)) {
        work_proof_size = *rangeproof_size;
      } else {
        work_proof_size = 4 + CalculateRangeProofSize(
                                  kIssuanceAmount, exponent, minimum_bits);
        if (rangeproof_size != nullptr) *rangeproof_size = work_proof_size;
      }
      if (is_reissuance) {
        work_proof_size += 1;
      } else {
        work_proof_size *= 2;
      }
      witness_size += work_proof_size;
    }
  }

  if (witness_area_size != nullptr) {
    *witness_area_size = witness_size;
  }
  if (no_witness_area_size != nullptr) {
    *no_witness_area_size = size;
  }
  return size + witness_size;
}